

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::cmCommonTargetGenerator
          (cmCommonTargetGenerator *this,cmGeneratorTarget *gt)

{
  cmGlobalGenerator *pcVar1;
  string *psVar2;
  cmGeneratorTarget *gt_local;
  cmCommonTargetGenerator *this_local;
  
  this->_vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmCommonTargetGenerator_009667c0;
  this->GeneratorTarget = gt;
  this->Makefile = gt->Makefile;
  this->LocalCommonGenerator = (cmLocalCommonGenerator *)gt->LocalGenerator;
  pcVar1 = cmLocalGenerator::GetGlobalGenerator(gt->LocalGenerator);
  this->GlobalCommonGenerator = (cmGlobalCommonGenerator *)pcVar1;
  psVar2 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(this->LocalCommonGenerator);
  std::__cxx11::string::string((string *)&this->ConfigName,(string *)psVar2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->FlagsByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->DefinesByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->IncludesByLanguage);
  return;
}

Assistant:

cmCommonTargetGenerator::cmCommonTargetGenerator(cmGeneratorTarget* gt)
  : GeneratorTarget(gt)
  , Makefile(gt->Makefile)
  , LocalCommonGenerator(
      static_cast<cmLocalCommonGenerator*>(gt->LocalGenerator))
  , GlobalCommonGenerator(static_cast<cmGlobalCommonGenerator*>(
      gt->LocalGenerator->GetGlobalGenerator()))
  , ConfigName(LocalCommonGenerator->GetConfigName())
{
}